

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.h
# Opt level: O0

void __thiscall re2::Regexp::AllocSub(Regexp *this,int n)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  ulong uVar3;
  Regexp **ppRVar4;
  LogMessage local_198;
  int local_14;
  Regexp *pRStack_10;
  int n_local;
  Regexp *this_local;
  
  local_14 = n;
  pRStack_10 = this;
  if ((n < 0) || ((n & 0xffffU) != n)) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h",0x1ee
              );
    poVar2 = LogMessage::stream(&local_198);
    poVar2 = std::operator<<(poVar2,"Cannot AllocSub ");
    std::ostream::operator<<(poVar2,local_14);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  if (1 < local_14) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)local_14;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppRVar4 = (Regexp **)operator_new__(uVar3);
    (this->field_5).submany_ = ppRVar4;
  }
  this->nsub_ = (uint16)local_14;
  return;
}

Assistant:

void AllocSub(int n) {
    if (n < 0 || static_cast<uint16>(n) != n)
      LOG(FATAL) << "Cannot AllocSub " << n;
    if (n > 1)
      submany_ = new Regexp*[n];
    nsub_ = n;
  }